

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::full_description(string *__return_storage_ptr__,
                  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,string *desc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def;
  bool bVar1;
  string local_138 [32];
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  byte local_d2;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *desc_local;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = desc;
  desc_local = (string *)this;
  this_local = (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  std::operator+(&local_80,desc," (");
  detail::readable_typename<std::__cxx11::string>();
  std::operator+(&local_60,&local_80,&local_a0);
  local_d2 = 0;
  bVar1 = (this->need & 1U) == 0;
  if (bVar1) {
    std::__cxx11::string::string(local_138,(string *)&this->def);
    detail::default_value<std::__cxx11::string>(&local_118,(detail *)local_138,def);
    std::operator+(&local_f8," [=",&local_118);
    std::operator+(&local_d0,&local_f8,"]");
  }
  else {
    std::allocator<char>::allocator();
    local_d2 = 1;
    std::__cxx11::string::string((string *)&local_d0,"",&local_d1);
  }
  std::operator+(&local_40,&local_60,&local_d0);
  std::operator+(__return_storage_ptr__,&local_40,")");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string(local_138);
  }
  if ((local_d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string full_description(const std::string &desc){
      return
        desc+" ("+detail::readable_typename<T>()+
        (need?"":" [="+detail::default_value<T>(def)+"]")
        +")";
    }